

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHull.cpp
# Opt level: O1

void __thiscall HullLibrary::extrude(HullLibrary *this,cbtHullTriangle *t0,int v)

{
  int c;
  int b;
  int c_00;
  int iVar1;
  long lVar2;
  cbtHullTriangle *pcVar3;
  cbtHullTriangle *s;
  int *piVar4;
  cbtHullTriangle *s_00;
  cbtHullTriangle *s_01;
  int iVar5;
  int iVar6;
  
  c = (t0->super_cbtInt3).x;
  b = (t0->super_cbtInt3).y;
  c_00 = (t0->super_cbtInt3).z;
  iVar1 = *(int *)(this + 4);
  s = allocateTriangle(this,v,b,c_00);
  iVar6 = iVar1 + 1;
  iVar5 = iVar1 + 2;
  (s->n).x = (t0->n).x;
  (s->n).y = iVar6;
  (s->n).z = iVar5;
  piVar4 = cbtHullTriangle::neib
                     (*(cbtHullTriangle **)(*(long *)(this + 0x10) + (long)(t0->n).x * 8),b,c_00);
  *piVar4 = iVar1;
  s_00 = allocateTriangle(this,v,c_00,c);
  (s_00->n).x = (t0->n).y;
  (s_00->n).y = iVar5;
  (s_00->n).z = iVar1;
  piVar4 = cbtHullTriangle::neib
                     (*(cbtHullTriangle **)(*(long *)(this + 0x10) + (long)(t0->n).y * 8),c_00,c);
  *piVar4 = iVar6;
  s_01 = allocateTriangle(this,v,c,b);
  (s_01->n).x = (t0->n).z;
  (s_01->n).y = iVar1;
  (s_01->n).z = iVar6;
  lVar2 = *(long *)(this + 0x10);
  piVar4 = cbtHullTriangle::neib(*(cbtHullTriangle **)(lVar2 + (long)(t0->n).z * 8),c,b);
  *piVar4 = iVar5;
  pcVar3 = *(cbtHullTriangle **)(lVar2 + (long)(s->n).x * 8);
  if ((((pcVar3->super_cbtInt3).x == v) || ((pcVar3->super_cbtInt3).y == v)) ||
     ((pcVar3->super_cbtInt3).z == v)) {
    removeb2b(this,s,pcVar3);
  }
  pcVar3 = *(cbtHullTriangle **)(*(long *)(this + 0x10) + (long)(s_00->n).x * 8);
  if ((((pcVar3->super_cbtInt3).x == v) || ((pcVar3->super_cbtInt3).y == v)) ||
     ((pcVar3->super_cbtInt3).z == v)) {
    removeb2b(this,s_00,pcVar3);
  }
  pcVar3 = *(cbtHullTriangle **)(*(long *)(this + 0x10) + (long)(s_01->n).x * 8);
  if ((((pcVar3->super_cbtInt3).x == v) || ((pcVar3->super_cbtInt3).y == v)) ||
     ((pcVar3->super_cbtInt3).z == v)) {
    removeb2b(this,s_01,pcVar3);
  }
  *(undefined8 *)(*(long *)(this + 0x10) + (long)t0->id * 8) = 0;
  cbtAlignedFreeInternal(t0);
  return;
}

Assistant:

void HullLibrary::extrude(cbtHullTriangle *t0, int v)
{
    cbtInt3 t = *t0;
	int n = m_tris.size();
	cbtHullTriangle *ta = allocateTriangle(v, t[1], t[2]);
    ta->n = cbtInt3(t0->n[0], n + 1, n + 2);
	m_tris[t0->n[0]]->neib(t[1], t[2]) = n + 0;
	cbtHullTriangle *tb = allocateTriangle(v, t[2], t[0]);
    tb->n = cbtInt3(t0->n[1], n + 2, n + 0);
	m_tris[t0->n[1]]->neib(t[2], t[0]) = n + 1;
	cbtHullTriangle *tc = allocateTriangle(v, t[0], t[1]);
    tc->n = cbtInt3(t0->n[2], n + 0, n + 1);
	m_tris[t0->n[2]]->neib(t[0], t[1]) = n + 2;
	checkit(ta);
	checkit(tb);
	checkit(tc);
	if (hasvert(*m_tris[ta->n[0]], v)) removeb2b(ta, m_tris[ta->n[0]]);
	if (hasvert(*m_tris[tb->n[0]], v)) removeb2b(tb, m_tris[tb->n[0]]);
	if (hasvert(*m_tris[tc->n[0]], v)) removeb2b(tc, m_tris[tc->n[0]]);
	deAllocateTriangle(t0);
}